

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O0

void * arkStep_GetLmem(void *arkode_mem)

{
  int iVar1;
  int retval;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  char *in_stack_ffffffffffffffe0;
  void *in_stack_ffffffffffffffe8;
  void *local_8;
  
  iVar1 = arkStep_AccessStepMem
                    (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
                     (ARKodeMem *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                     (ARKodeARKStepMem *)0xe89d54);
  if (iVar1 == 0) {
    local_8 = *(void **)(in_stack_ffffffffffffffe0 + 0x128);
  }
  else {
    local_8 = (void *)0x0;
  }
  return local_8;
}

Assistant:

void* arkStep_GetLmem(void* arkode_mem)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeARKStepMem structure, and return lmem */
  retval = arkStep_AccessStepMem(arkode_mem, "arkStep_GetLmem",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(NULL);
  return(step_mem->lmem);
}